

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  undefined1 auVar1 [16];
  anon_class_24_3_6b44205e P;
  anon_class_24_3_03b17d9d P_00;
  Float FVar2;
  float fVar3;
  Float FVar4;
  Tuple2<pbrt::Point2,_float> TVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  Float bInt;
  Float condIntegral;
  Bounds2f bCond;
  Float local_7c;
  Point2f local_78;
  Float local_6c;
  WindowedPiecewiseConstant2D *local_68;
  Bounds2f *pBStack_60;
  Float *local_58;
  WindowedPiecewiseConstant2D *local_50;
  Bounds2f *pBStack_48;
  Float *local_40;
  Bounds2f local_38;
  
  FVar2 = SummedAreaTable::Integral(&this->sat,b);
  if ((FVar2 != 0.0) || (NAN(FVar2))) {
    local_7c = SummedAreaTable::Integral(&this->sat,b);
    local_40 = &local_7c;
    P.b = b;
    P.this = this;
    P.bInt = local_40;
    local_50 = this;
    pBStack_48 = b;
    local_78.super_Tuple2<pbrt::Point2,_float>.x =
         SampleBisection<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                   (P,(u->super_Tuple2<pbrt::Point2,_float>).x,
                    (b->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                    (b->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                    (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                    (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    fVar7 = (float)((this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                   (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    fVar3 = local_78.super_Tuple2<pbrt::Point2,_float>.x * fVar7;
    auVar6 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
    auVar1 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),10);
    auVar8._0_4_ = auVar6._0_4_ / fVar7;
    auVar8._4_12_ = auVar6._4_12_;
    auVar6._0_4_ = auVar1._0_4_ / fVar7;
    auVar6._4_12_ = auVar1._4_12_;
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(b->pMax).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar1 = vinsertps_avx(auVar8,ZEXT416((uint)(b->pMin).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar8 = vminps_avx(auVar6,auVar1);
    auVar6 = vmaxps_avx(auVar6,auVar1);
    fVar3 = auVar6._0_4_;
    local_38 = (Bounds2f)vmovlhps_avx(auVar8,auVar6);
    if ((auVar8._0_4_ == fVar3) && (!NAN(auVar8._0_4_) && !NAN(fVar3))) {
      local_38.pMax.super_Tuple2<pbrt::Point2,_float>.x = 1.0 / fVar7 + fVar3;
    }
    FVar2 = SummedAreaTable::Integral(&this->sat,&local_38);
    FVar4 = 0.0;
    TVar5.x = 0.0;
    TVar5.y = 0.0;
    if ((FVar2 != 0.0) || (NAN(FVar2))) {
      local_6c = SummedAreaTable::Integral(&this->sat,&local_38);
      local_58 = &local_6c;
      P_00.bCond = &local_38;
      P_00.this = this;
      P_00.condIntegral = local_58;
      local_68 = this;
      pBStack_60 = &local_38;
      local_78.super_Tuple2<pbrt::Point2,_float>.y =
           SampleBisection<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                     (P_00,(u->super_Tuple2<pbrt::Point2,_float>).y,
                      (b->pMin).super_Tuple2<pbrt::Point2,_float>.y,
                      (b->pMax).super_Tuple2<pbrt::Point2,_float>.y,
                      (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                      (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      FVar4 = Eval(this,&local_78);
      FVar4 = FVar4 / local_7c;
      TVar5.y = local_78.super_Tuple2<pbrt::Point2,_float>.y;
      TVar5.x = local_78.super_Tuple2<pbrt::Point2,_float>.x;
    }
    *pdf = FVar4;
  }
  else {
    *pdf = 0.0;
    TVar5.x = 0.0;
    TVar5.y = 0.0;
  }
  return (Point2f)TVar5;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Integral(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Define lambda function _Px_ for marginal cumulative distribution
        Float bInt = sat.Integral(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Integral(bx) / bInt;
        };

        // Sample marginal windowed function in $x$
        Point2f p;
        p.x = SampleBisection(Px, u[0], b.pMin.x, b.pMax.x, func.xSize());

        // Sample conditional windowed function in $y$
        // Compute 2D bounds _bCond_ for conditional sampling
        int nx = func.xSize();
        Bounds2f bCond(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                       Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (bCond.pMin.x == bCond.pMax.x)
            bCond.pMax.x += 1.f / nx;
        if (sat.Integral(bCond) == 0) {
            *pdf = 0;
            return {};
        }

        // Define lambda function for conditional distribution and sample $y$
        Float condIntegral = sat.Integral(bCond);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f by = bCond;
            by.pMax.y = y;
            return sat.Integral(by) / condIntegral;
        };
        p.y = SampleBisection(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = Eval(p) / bInt;
        return p;
    }